

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::addFrom_pos(Mat *this,char **p)

{
  pointer p_Var1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  Constant::Util::char_to_int(p);
  Constant::Util::char_to_int(p);
  uVar3 = this->c * this->r;
  if (0 < (int)uVar3) {
    lVar7 = 0;
    do {
      uVar4 = Constant::Util::char_to_ll(p);
      p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = uVar4 + *(ulong *)((long)p_Var1 + lVar7);
      lVar6 = ((long)uVar4 >> 0x3f) + *(long *)((long)p_Var1 + lVar7 + 8) +
              (ulong)CARRY8(uVar4,*(ulong *)((long)p_Var1 + lVar7));
      uVar4 = uVar5 + 0x16345785d8a0003;
      lVar2 = lVar6 + (ulong)(0xfe9cba87a275fffc < uVar5);
      if ((SBORROW8(lVar6,-1) != SBORROW8(lVar6 + 1,(ulong)(uVar5 < 0xfe9cba87a275fffe))) ==
          (long)((lVar6 + 1) - (ulong)(uVar5 < 0xfe9cba87a275fffe)) < 0) {
        uVar4 = uVar5;
        lVar2 = lVar6;
      }
      if (-lVar6 < (long)(ulong)(0x16345785d8a0002 < uVar5)) {
        uVar4 = uVar5 + 0xfe9cba87a275fffd;
        lVar2 = lVar6 + -1 + (ulong)(0x16345785d8a0002 < uVar5);
      }
      *(ulong *)((long)p_Var1 + lVar7) = uVar4;
      *(long *)((long)p_Var1 + lVar7 + 8) = lVar2;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar7);
  }
  return;
}

Assistant:

void Mat::addFrom_pos(char *&p) {
    int tmp_r, tmp_c;
    tmp_r = Constant::Util::char_to_int(p);
    tmp_c = Constant::Util::char_to_int(p);
    int l = r * c;
//    cout << "l: " << l << endl;
    for (int i = 0; i < l; i++) {
        val[i] += Constant::Util::char_to_ll(p);
        val[i] = val[i] >= MOD ? val[i] - MOD : val[i];
        val[i] = val[i] <= -MOD ? val[i] + MOD : val[i];
    }
}